

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm_suite.cpp
# Opt level: O3

void pop_sorted_suite::pop_increasing(void)

{
  long lVar1;
  int iVar2;
  array<int,_4UL> storage;
  array<int,_4UL> expect;
  int local_38 [2];
  
  storage._M_elems[0] = 0xb;
  storage._M_elems[1] = 0x16;
  storage._M_elems[2] = 0x21;
  storage._M_elems[3] = 0x2c;
  lVar1 = 4;
  do {
    *(undefined4 *)((long)expect._M_elems + lVar1 + -0x14) =
         *(undefined4 *)((long)storage._M_elems + lVar1);
    *(undefined4 *)((long)storage._M_elems + lVar1) = 0xb;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x10);
  expect._M_elems[0] = 0x16;
  expect._M_elems[1] = 0x21;
  expect._M_elems[2] = 0x2c;
  expect._M_elems[3] = 0xb;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x51e,"void pop_sorted_suite::pop_increasing()",storage._M_elems,expect._M_elems,
             expect._M_elems,local_38);
  lVar1 = 4;
  iVar2 = storage._M_elems[0];
  do {
    *(undefined4 *)((long)expect._M_elems + lVar1 + -0x14) =
         *(undefined4 *)((long)storage._M_elems + lVar1);
    *(int *)((long)storage._M_elems + lVar1) = iVar2;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0xc);
  expect._M_elems[0] = 0x21;
  expect._M_elems[1] = 0x2c;
  expect._M_elems[2] = 0x16;
  expect._M_elems[3] = 0xb;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x525,"void pop_sorted_suite::pop_increasing()",storage._M_elems,expect._M_elems,
             expect._M_elems,local_38);
  iVar2 = storage._M_elems[1];
  storage._M_elems[1] = storage._M_elems[0];
  storage._M_elems[0] = iVar2;
  expect._M_elems[0] = 0x2c;
  expect._M_elems[1] = 0x21;
  expect._M_elems[2] = 0x16;
  expect._M_elems[3] = 0xb;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x52c,"void pop_sorted_suite::pop_increasing()",storage._M_elems,expect._M_elems,
             expect._M_elems,local_38);
  expect._M_elems[0] = 0x2c;
  expect._M_elems[1] = 0x21;
  expect._M_elems[2] = 0x16;
  expect._M_elems[3] = 0xb;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x533,"void pop_sorted_suite::pop_increasing()",storage._M_elems,expect._M_elems,
             expect._M_elems,local_38);
  return;
}

Assistant:

void pop_increasing()
{
    std::array<int, 4> storage = { 11, 22, 33, 44 };
    auto last = storage.end();
    pop_sorted(storage.begin(), last);
    {
        std::array<int, 4> expect = { 22, 33, 44, 11 };
        BOOST_TEST_ALL_EQ(storage.begin(), storage.end(),
                          expect.begin(), expect.end());
    }
    --last;
    pop_sorted(storage.begin(), last);
    {
        std::array<int, 4> expect = { 33, 44, 22, 11 };
        BOOST_TEST_ALL_EQ(storage.begin(), storage.end(),
                          expect.begin(), expect.end());
    }
    --last;
    pop_sorted(storage.begin(), last);
    {
        std::array<int, 4> expect = { 44, 33, 22, 11 };
        BOOST_TEST_ALL_EQ(storage.begin(), storage.end(),
                          expect.begin(), expect.end());
    }
    --last;
    pop_sorted(storage.begin(), last);
    {
        std::array<int, 4> expect = { 44, 33, 22, 11 };
        BOOST_TEST_ALL_EQ(storage.begin(), storage.end(),
                          expect.begin(), expect.end());
    }
}